

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexture.cpp
# Opt level: O3

bool QOpenGLTexture::hasFeature(Feature feature)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  QByteArray *pQVar4;
  long *plVar5;
  char *pcVar6;
  undefined8 uVar7;
  long lVar8;
  int iVar9;
  long in_FS_OFFSET;
  bool bVar10;
  QSurfaceFormat f;
  undefined1 *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = (QByteArray *)QOpenGLContext::currentContext();
  if (pQVar4 == (QByteArray *)0x0) {
    hasFeature();
    bVar2 = 0;
    goto LAB_00153be2;
  }
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  QOpenGLContext::format();
  cVar1 = QOpenGLContext::isOpenGLES();
  if (cVar1 != '\0') goto LAB_001532e6;
  bVar2 = 0;
  if ((int)feature < 0x100) {
    if ((int)feature < 0x10) {
      bVar2 = 0;
      switch(feature) {
      case ImmutableStorage:
        uVar7 = QSurfaceFormat::version();
        if (((int)uVar7 < 4) || (bVar2 = 1, (int)((ulong)uVar7 >> 0x20) < 2 && (int)uVar7 == 4)) {
          cVar1 = QOpenGLContext::hasExtension(pQVar4);
          bVar2 = 1;
          if (cVar1 == '\0') {
LAB_00153b72:
            bVar2 = QOpenGLContext::hasExtension(pQVar4);
          }
        }
        break;
      case ImmutableMultisampleStorage:
        uVar7 = QSurfaceFormat::version();
        if (((int)uVar7 < 4) || (bVar2 = 1, (int)((ulong)uVar7 >> 0x20) < 3 && (int)uVar7 == 4)) {
LAB_00153ac1:
          bVar2 = QOpenGLContext::hasExtension(pQVar4);
        }
        break;
      case TextureRectangle:
        uVar7 = QSurfaceFormat::version();
        if (((int)uVar7 < 2) || (bVar2 = 1, (int)((ulong)uVar7 >> 0x20) < 1 && (int)uVar7 == 2))
        goto LAB_00153ac1;
        break;
      case TextureArrays:
        lVar8 = QSurfaceFormat::version();
        if (((int)lVar8 < 3) || (bVar2 = 1, lVar8 < 0 && (int)lVar8 == 3)) goto LAB_00153ac1;
      }
    }
    else if ((int)feature < 0x40) {
      if (feature == Texture3D) {
        uVar7 = QSurfaceFormat::version();
        iVar3 = (int)uVar7;
        if (iVar3 < 1) goto LAB_001532e6;
        iVar9 = (int)((ulong)uVar7 >> 0x20);
        bVar10 = SBORROW4(iVar9,3);
        iVar9 = iVar9 + -3;
LAB_00153a52:
        bVar10 = bVar10 == iVar9 < 0;
LAB_00153a56:
        bVar2 = bVar10 | iVar3 != 1;
      }
      else {
        bVar2 = 0;
        if (feature == TextureMultisample) {
          uVar7 = QSurfaceFormat::version();
          if (((int)uVar7 < 3) || (bVar2 = 1, (int)((ulong)uVar7 >> 0x20) < 2 && (int)uVar7 == 3))
          goto LAB_00153ac1;
        }
      }
    }
    else if (feature == TextureBuffer) {
      lVar8 = QSurfaceFormat::version();
      if (((int)lVar8 < 3) || (bVar2 = 1, lVar8 < 0 && (int)lVar8 == 3)) goto LAB_00153ac1;
    }
    else if (feature == TextureCubeMapArrays) {
      lVar8 = QSurfaceFormat::version();
      if (((int)lVar8 < 4) || (bVar2 = 1, lVar8 < 0 && (int)lVar8 == 4)) goto LAB_00153ac1;
    }
  }
  else if ((int)feature < 0x1000) {
    if ((int)feature < 0x400) {
      if (feature == Swizzle) {
        uVar7 = QSurfaceFormat::version();
        if (((int)uVar7 < 3) || (bVar2 = 1, (int)((ulong)uVar7 >> 0x20) < 3 && (int)uVar7 == 3))
        goto LAB_00153ac1;
      }
      else if (feature == StencilTexturing) {
        uVar7 = QSurfaceFormat::version();
        if (((int)uVar7 < 4) || (bVar2 = 1, (int)((ulong)uVar7 >> 0x20) < 3 && (int)uVar7 == 4))
        goto LAB_00153ac1;
      }
    }
    else if ((feature == AnisotropicFiltering) || (feature == NPOTTextures)) goto LAB_00153ac1;
  }
  else if ((int)feature < 0x4000) {
    if (feature == NPOTTextureRepeat) goto LAB_00153ac1;
    if (feature == Texture1D) {
      uVar7 = QSurfaceFormat::version();
      iVar3 = (int)uVar7;
      if (0 < iVar3) {
        bVar10 = 0 < (int)((ulong)uVar7 >> 0x20);
        goto LAB_00153a56;
      }
LAB_001532e6:
      bVar2 = 0;
    }
  }
  else if (feature == TextureComparisonOperators) {
    uVar7 = QSurfaceFormat::version();
    if (((int)uVar7 < 1) || (bVar2 = 1, (int)((ulong)uVar7 >> 0x20) < 5 && (int)uVar7 == 1)) {
      cVar1 = QOpenGLContext::hasExtension(pQVar4);
      if (cVar1 != '\0') goto LAB_00153b72;
      bVar2 = 0;
    }
  }
  else if (feature == TextureMipMapLevel) {
    uVar7 = QSurfaceFormat::version();
    iVar3 = (int)uVar7;
    if (0 < iVar3) {
      iVar9 = (int)((ulong)uVar7 >> 0x20);
      bVar10 = SBORROW4(iVar9,2);
      iVar9 = iVar9 + -2;
      goto LAB_00153a52;
    }
    goto LAB_001532e6;
  }
  cVar1 = QOpenGLContext::isOpenGLES();
  if (cVar1 != '\0') {
    plVar5 = (long *)QOpenGLContext::functions();
    pcVar6 = (char *)(**(code **)(*plVar5 + 0xd0))(0x1f01);
    if ((int)feature < 0x100) {
      if ((int)feature < 8) {
        if (feature == ImmutableStorage) {
          lVar8 = QSurfaceFormat::version();
          if (((int)lVar8 < 3) || (lVar8 < 0 && (int)lVar8 == 3)) {
            cVar1 = QOpenGLContext::hasExtension(pQVar4);
            if (cVar1 == '\0') {
              bVar2 = 0;
            }
            else if (pcVar6 == (char *)0x0) {
              bVar2 = 1;
            }
            else {
              pcVar6 = strstr(pcVar6,"Mali");
              bVar2 = pcVar6 == (char *)0x0;
            }
          }
          else if (pcVar6 == (char *)0x0) {
            bVar2 = 1;
          }
          else {
            pcVar6 = strstr(pcVar6,"Mali");
            bVar2 = pcVar6 == (char *)0x0;
          }
        }
        else if (feature == ImmutableMultisampleStorage) {
LAB_001535d0:
          uVar7 = QSurfaceFormat::version();
          if ((int)uVar7 < 3) goto LAB_001535e3;
          bVar2 = 0 < (int)((ulong)uVar7 >> 0x20) || (int)uVar7 != 3;
        }
      }
      else {
        if (feature == TextureArrays) goto LAB_001534e3;
        if (feature == Texture3D) {
          lVar8 = QSurfaceFormat::version();
          if (((int)lVar8 < 3) || (bVar2 = 1, lVar8 < 0 && (int)lVar8 == 3)) goto LAB_0015388f;
        }
        else if (feature == TextureMultisample) goto LAB_001535d0;
      }
    }
    else if ((int)feature < 0x1000) {
      if (feature == Swizzle) {
LAB_001534e3:
        lVar8 = QSurfaceFormat::version();
        if ((int)lVar8 < 3) {
LAB_001535e3:
          bVar2 = 0;
        }
        else {
          bVar2 = -1 < lVar8 || (int)lVar8 != 3;
        }
      }
      else if (feature == AnisotropicFiltering) {
LAB_0015388f:
        bVar2 = QOpenGLContext::hasExtension(pQVar4);
      }
      else if (feature == NPOTTextures) goto LAB_001535ea;
    }
    else if (feature == NPOTTextureRepeat) {
LAB_001535ea:
      lVar8 = QSurfaceFormat::version();
      if (((int)lVar8 < 3) || (bVar2 = 1, lVar8 < 0 && (int)lVar8 == 3)) {
        cVar1 = QOpenGLContext::hasExtension(pQVar4);
        bVar2 = 1;
        if (cVar1 == '\0') {
          bVar2 = QOpenGLContext::hasExtension(pQVar4);
        }
      }
    }
    else if (feature == TextureComparisonOperators) {
      lVar8 = QSurfaceFormat::version();
      if (((int)lVar8 < 3) || (bVar2 = 1, lVar8 < 0 && (int)lVar8 == 3)) goto LAB_0015388f;
    }
    else if (feature == TextureMipMapLevel) goto LAB_001534e3;
  }
  QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_30);
LAB_00153be2:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return (bool)bVar2;
}

Assistant:

bool QOpenGLTexture::hasFeature(Feature feature)
{
    QOpenGLContext *ctx = QOpenGLContext::currentContext();
    if (!ctx) {
        qWarning("QOpenGLTexture::hasFeature() requires a valid current context");
        return false;
    }

    QSurfaceFormat f = ctx->format();

    bool supported = false;

#if !QT_CONFIG(opengles2)
    if (!ctx->isOpenGLES()) {
        switch (feature) {
        case ImmutableMultisampleStorage:
            supported = f.version() >= std::pair(4, 3)
                    || ctx->hasExtension(QByteArrayLiteral("GL_ARB_texture_storage_multisample"));
            break;

        case TextureBuffer:
            supported = f.version() >= std::pair(3, 0)
                    || ctx->hasExtension(QByteArrayLiteral("GL_ARB_texture_buffer_object"));
            break;

        case StencilTexturing:
            supported = f.version() >= std::pair(4, 3)
                    || ctx->hasExtension(QByteArrayLiteral("GL_ARB_stencil_texturing"));
            break;

        case ImmutableStorage:
            supported = f.version() >= std::pair(4, 2)
                    || ctx->hasExtension(QByteArrayLiteral("GL_ARB_texture_storage"))
                    || ctx->hasExtension(QByteArrayLiteral("GL_EXT_texture_storage"));
            break;

        case TextureCubeMapArrays:
            supported = f.version() >= std::pair(4, 0)
                    || ctx->hasExtension(QByteArrayLiteral("ARB_texture_cube_map_array"));
            break;

        case Swizzle:
            supported = f.version() >= std::pair(3, 3)
                    || ctx->hasExtension(QByteArrayLiteral("GL_ARB_texture_swizzle"));
            break;

        case TextureMultisample:
            supported = f.version() >= std::pair(3, 2)
                    || ctx->hasExtension(QByteArrayLiteral("GL_ARB_texture_multisample"));
            break;

        case TextureArrays:
            supported = f.version() >= std::pair(3, 0)
                    || ctx->hasExtension(QByteArrayLiteral("GL_EXT_texture_array"));
            break;

        case TextureRectangle:
            supported = f.version() >= std::pair(2, 1)
                    || ctx->hasExtension(QByteArrayLiteral("ARB_texture_rectangle"));
            break;

        case Texture3D:
            supported = f.version() >= std::pair(1, 3);
            break;

        case AnisotropicFiltering:
            supported = ctx->hasExtension(QByteArrayLiteral("GL_EXT_texture_filter_anisotropic"));
            break;

        case NPOTTextures:
        case NPOTTextureRepeat:
            supported = ctx->hasExtension(QByteArrayLiteral("GL_ARB_texture_non_power_of_two"));
            break;

        case Texture1D:
            supported = f.version() >= std::pair(1, 1);
            break;

        case TextureComparisonOperators:
            // GL 1.4 and GL_ARB_shadow alone support only LEQUAL and GEQUAL;
            // since we're talking about history anyhow avoid to be extra pedantic
            // in the feature set, and simply claim supported if we have the full set of operators
            // (which has been added into 1.5 / GL_EXT_shadow_funcs).
            supported = f.version() >= std::pair(1, 5)
                    || (ctx->hasExtension(QByteArrayLiteral("GL_ARB_shadow"))
                        && ctx->hasExtension(QByteArrayLiteral("GL_EXT_shadow_funcs")));
            break;

        case TextureMipMapLevel:
            supported = f.version() >= std::pair(1, 2);
            break;

        case MaxFeatureFlag:
            break;
        }
    }

    if (ctx->isOpenGLES())
#endif
    {
        const char *renderer = reinterpret_cast<const char *>(ctx->functions()->glGetString(GL_RENDERER));
        switch (feature) {
        case ImmutableStorage:
            supported = (f.version() >= std::pair(3, 0) || ctx->hasExtension(QByteArrayLiteral("GL_EXT_texture_storage")))
                && !(renderer && strstr(renderer, "Mali")); // do not use on Mali: QTBUG-45106
            break;

        case ImmutableMultisampleStorage:
            supported = f.version() >= std::pair(3, 1);
            break;

        case TextureRectangle:
            break;

        case TextureArrays:
            supported = f.version() >= std::pair(3, 0);
            break;

        case Texture3D:
            supported = f.version() >= std::pair(3, 0)
                    || ctx->hasExtension(QByteArrayLiteral("GL_OES_texture_3D"));
            break;

        case TextureMultisample:
            supported = f.version() >= std::pair(3, 1);
            break;

        case TextureBuffer:
            break;

        case TextureCubeMapArrays:
            break;

        case Swizzle:
            supported = f.version() >= std::pair(3, 0);
            break;

        case StencilTexturing:
            break;

        case AnisotropicFiltering:
            supported = ctx->hasExtension(QByteArrayLiteral("GL_EXT_texture_filter_anisotropic"));
            break;

        case NPOTTextures:
        case NPOTTextureRepeat:
            supported = f.version() >= std::pair(3,0)
                    || ctx->hasExtension(QByteArrayLiteral("GL_OES_texture_npot"))
                    || ctx->hasExtension(QByteArrayLiteral("GL_ARB_texture_non_power_of_two"));
            break;

        case Texture1D:
            break;

        case TextureComparisonOperators:
            supported = f.version() >= std::pair(3, 0)
                    || ctx->hasExtension(QByteArrayLiteral("GL_EXT_shadow_samplers"));
            break;

        case TextureMipMapLevel:
            supported = f.version() >= std::pair(3, 0);
            break;

        case MaxFeatureFlag:
            break;
        }
    }

    return supported;
}